

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.hpp
# Opt level: O0

void __thiscall
csv::internals::ThreadSafeDeque<csv::CSVRow>::push_back
          (ThreadSafeDeque<csv::CSVRow> *this,CSVRow *item)

{
  size_t sVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  CSVRow *item_local;
  ThreadSafeDeque<csv::CSVRow> *this_local;
  
  lock._M_device = (mutex_type *)item;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->_lock);
  std::deque<csv::CSVRow,_std::allocator<csv::CSVRow>_>::push_back
            (&this->data,(value_type *)lock._M_device);
  sVar1 = size(this);
  if (this->_notify_size <= sVar1) {
    std::condition_variable::notify_all();
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void push_back(T&& item) {
                std::lock_guard<std::mutex> lock{ this->_lock };
                this->data.push_back(std::move(item));

                if (this->size() >= _notify_size) {
                    this->_cond.notify_all();
                }
            }